

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O0

void __thiscall trackerboy::apu::Mixer::setBuffer(Mixer *this,size_t samples)

{
  unique_ptr<float[],_std::default_delete<float[]>_> local_28;
  size_t local_20;
  size_t size;
  size_t samples_local;
  Mixer *this_local;
  
  local_20 = (samples + 0x10) * 2;
  size = samples;
  samples_local = (size_t)this;
  if (local_20 != this->mBuffersize) {
    std::make_unique<float[]>((size_t)&local_28);
    std::unique_ptr<float[],_std::default_delete<float[]>_>::operator=(&this->mBuffer,&local_28);
    std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&local_28);
    this->mBuffersize = local_20;
  }
  clear(this);
  return;
}

Assistant:

void Mixer::setBuffer(size_t samples) {
    auto size = (samples + TU::STEP_WIDTH) * 2;
    if (size != mBuffersize) {
        mBuffer = std::make_unique<float[]>(size);
        mBuffersize = size;
    }
    clear();
}